

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

bool Assimp::BaseImporter::SimpleExtensionCheck(string *pFile,char *ext0,char *ext1,char *ext2)

{
  int iVar1;
  long lVar2;
  char *__s1;
  
  lVar2 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar2 != -1) {
    if (ext0 == (char *)0x0) {
      __assert_fail("__null != s2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                    ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    __s1 = (pFile->_M_dataplus)._M_p + lVar2 + 1;
    iVar1 = strcasecmp(__s1,ext0);
    if (iVar1 == 0) {
      return true;
    }
    if ((ext1 != (char *)0x0) && (iVar1 = strcasecmp(__s1,ext1), iVar1 == 0)) {
      return true;
    }
    if ((ext2 != (char *)0x0) && (iVar1 = strcasecmp(__s1,ext2), iVar1 == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool BaseImporter::SimpleExtensionCheck (const std::string& pFile,
    const char* ext0,
    const char* ext1,
    const char* ext2)
{
    std::string::size_type pos = pFile.find_last_of('.');

    // no file extension - can't read
    if( pos == std::string::npos)
        return false;

    const char* ext_real = & pFile[ pos+1 ];
    if( !ASSIMP_stricmp(ext_real,ext0) )
        return true;

    // check for other, optional, file extensions
    if (ext1 && !ASSIMP_stricmp(ext_real,ext1))
        return true;

    if (ext2 && !ASSIMP_stricmp(ext_real,ext2))
        return true;

    return false;
}